

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

Dim * __thiscall
cnn::Max::dim_forward
          (Dim *__return_storage_ptr__,Max *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  Dim *a;
  pointer pDVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  ostream *poVar6;
  invalid_argument *this_00;
  pointer pDVar7;
  
  a = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.super__Vector_impl_data.
      _M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)a == 0x48) {
    bVar5 = operator!=(a,a + 1);
    if (!bVar5) {
      pDVar1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pDVar7 = pDVar1 + 1;
      if (pDVar1[1].bd <= pDVar1->bd) {
        pDVar7 = pDVar1;
      }
      __return_storage_ptr__->bd = pDVar7->bd;
      uVar2 = *(undefined8 *)(pDVar7->d + 2);
      uVar3 = *(undefined8 *)(pDVar7->d + 4);
      uVar4 = *(undefined8 *)(pDVar7->d + 6);
      *(undefined8 *)__return_storage_ptr__->d = *(undefined8 *)pDVar7->d;
      *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar2;
      *(undefined8 *)(__return_storage_ptr__->d + 4) = uVar3;
      *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar4;
      return __return_storage_ptr__;
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cerr,"Bad arguments in Max: ");
  poVar6 = operator<<(poVar6,xs);
  std::endl<char,std::char_traits<char>>(poVar6);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"invalid arguments to Max");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim Max::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 2 || xs[0] != xs[1]) {
    cerr << "Bad arguments in Max: " << xs << endl;
    throw std::invalid_argument("invalid arguments to Max");
  }
  return xs[0].bd >= xs[1].bd ? xs[0] : xs[1];
}